

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_4ebe96::BNTest_Pow2_Test::TestBody(BNTest_Pow2_Test *this)

{
  bool bVar1;
  int iVar2;
  BIGNUM *a;
  char *pcVar3;
  _Head_base<0UL,_bignum_st_*,_false> in_R9;
  _Head_base<0UL,_bignum_st_*,_false> _Var4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ScopedTrace gtest_trace_1764;
  ScopedTrace gtest_trace_1761;
  UniquePtr<BIGNUM> random;
  UniquePtr<BIGNUM> actual;
  UniquePtr<BIGNUM> expected;
  UniquePtr<BIGNUM> power_of_two;
  AssertHelper local_b0;
  Message local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  AssertHelper local_98;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  ScopedTrace local_69;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  ScopedTrace local_59;
  _Head_base<0UL,_bignum_st_*,_false> local_58;
  _Head_base<0UL,_bignum_st_*,_false> local_50;
  _Head_base<0UL,_bignum_st_*,_false> local_48;
  int local_3c;
  _Head_base<0UL,_bignum_st_*,_false> local_38;
  
  local_38._M_head_impl = (bignum_st *)BN_new();
  local_58._M_head_impl = (bignum_st *)BN_new();
  local_48._M_head_impl = (bignum_st *)BN_new();
  local_50._M_head_impl = (bignum_st *)BN_new();
  local_a8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)((BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((BIGNUM *)local_38._M_head_impl == (BIGNUM *)0x0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,(internal *)&local_a8,(AssertionResult *)"power_of_two","false",
               "true",(char *)in_R9._M_head_impl);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x6da,(char *)CONCAT71(local_90._1_7_,local_90[0]));
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_68);
  }
  else {
    local_a8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)((BIGNUM *)local_58._M_head_impl != (BIGNUM *)0x0);
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((BIGNUM *)local_58._M_head_impl == (BIGNUM *)0x0) {
      testing::Message::Message((Message *)&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,(internal *)&local_a8,(AssertionResult *)0x5cd951,"false","true"
                 ,(char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x6db,(char *)CONCAT71(local_90._1_7_,local_90[0]));
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_68);
    }
    else {
      local_a8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = (internal)((BIGNUM *)local_48._M_head_impl != (BIGNUM *)0x0);
      local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((BIGNUM *)local_48._M_head_impl == (BIGNUM *)0x0) {
        testing::Message::Message((Message *)&local_68);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_90,(internal *)&local_a8,(AssertionResult *)0x5b05de,"false",
                   "true",(char *)in_R9._M_head_impl);
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x6dc,(char *)CONCAT71(local_90._1_7_,local_90[0]));
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_68);
      }
      else {
        local_a8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ = (internal)((BIGNUM *)local_50._M_head_impl != (BIGNUM *)0x0);
        local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((bool)local_a8.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._0_1_) {
          local_68._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
          do {
            testing::ScopedTrace::ScopedTrace<unsigned_long>
                      (&local_59,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x6e1,(unsigned_long *)&local_68);
            local_3c = 3;
            do {
              testing::ScopedTrace::ScopedTrace<int>
                        (&local_69,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x6e4,&local_3c);
              _Var4._M_head_impl = local_38._M_head_impl;
              a = BN_value_one();
              iVar2 = BN_lshift((BIGNUM *)_Var4._M_head_impl,a,(int)local_68._M_head_impl);
              local_a8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_90,(internal *)&local_a8,
                           (AssertionResult *)
                           "BN_lshift(power_of_two.get(), BN_value_one(), (int)e)","false","true",
                           (char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_98,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x6e6,(char *)CONCAT71(local_90._1_7_,local_90[0]));
                testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
LAB_002c6efa:
                testing::internal::AssertHelper::~AssertHelper(&local_98);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_90._1_7_,local_90[0]) != &local_80) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_90._1_7_,local_90[0]),
                                  local_80._M_allocated_capacity + 1);
                }
                if (local_b0.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_b0.data_ + 8))();
                }
                if (local_a0 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_a0,local_a0);
                }
                testing::ScopedTrace::~ScopedTrace(&local_69);
                testing::ScopedTrace::~ScopedTrace(&local_59);
                goto LAB_002c6f58;
              }
              iVar2 = BN_is_pow2(local_38._M_head_impl);
              local_a8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_90,(internal *)&local_a8,
                           (AssertionResult *)"BN_is_pow2(power_of_two.get())","false","true",
                           (char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x6e9,(char *)CONCAT71(local_90._1_7_,local_90[0]));
                testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
                testing::internal::AssertHelper::~AssertHelper(&local_98);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_90._1_7_,local_90[0]) != &local_80) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_90._1_7_,local_90[0]),
                                  local_80._M_allocated_capacity + 1);
                }
                if (local_b0.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_b0.data_ + 8))();
                }
              }
              if (local_a0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_a0,local_a0);
              }
              iVar2 = BN_rand((BIGNUM *)local_58._M_head_impl,local_3c,1,0);
              local_a8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_90,(internal *)&local_a8,
                           (AssertionResult *)"BN_rand(random.get(), len, 1, 0)","false","true",
                           (char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_98,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x6ed,(char *)CONCAT71(local_90._1_7_,local_90[0]));
                testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
                goto LAB_002c6efa;
              }
              iVar2 = BN_is_pow2(local_58._M_head_impl);
              local_a8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 == 0);
              local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_90,(internal *)&local_a8,
                           (AssertionResult *)"BN_is_pow2(random.get())","true","false",
                           (char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x6f0,(char *)CONCAT71(local_90._1_7_,local_90[0]));
                testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
                testing::internal::AssertHelper::~AssertHelper(&local_98);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_90._1_7_,local_90[0]) != &local_80) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_90._1_7_,local_90[0]),
                                  local_80._M_allocated_capacity + 1);
                }
                if (local_b0.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_b0.data_ + 8))();
                }
              }
              if (local_a0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_a0,local_a0);
              }
              iVar2 = BN_div((BIGNUM *)0x0,(BIGNUM *)local_48._M_head_impl,
                             (BIGNUM *)local_58._M_head_impl,(BIGNUM *)local_38._M_head_impl,
                             (BN_CTX *)
                             (this->super_BNTest).ctx_._M_t.
                             super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
              local_a8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_90,(internal *)&local_a8,
                           (AssertionResult *)
                           "BN_div(__null, (expected.get()), (random.get()), (power_of_two.get()), (ctx()))"
                           ,"false","true",(char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_98,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x6f4,(char *)CONCAT71(local_90._1_7_,local_90[0]));
                testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
                goto LAB_002c6efa;
              }
              iVar2 = BN_mod_pow2(local_50._M_head_impl,local_58._M_head_impl,
                                  (size_t)local_68._M_head_impl);
              local_a8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_90,(internal *)&local_a8,
                           (AssertionResult *)"BN_mod_pow2(actual.get(), random.get(), e)","false",
                           "true",(char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_98,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x6f5,(char *)CONCAT71(local_90._1_7_,local_90[0]));
                testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
                goto LAB_002c6efa;
              }
              _Var4._M_head_impl = local_50._M_head_impl;
              AssertBIGNUMSEqual(local_90,"expected.get()","actual.get()",
                                 "random (mod power_of_two)",local_48._M_head_impl,
                                 local_50._M_head_impl);
              if (local_90[0] == '\0') {
                testing::Message::Message(&local_a8);
                pcVar3 = "";
                if (local_88 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar3 = (local_88->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x6f7,pcVar3);
                testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
                testing::internal::AssertHelper::~AssertHelper(&local_b0);
                if ((long *)CONCAT71(local_a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT71(local_a8.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._1_7_,
                                                 local_a8.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._0_1_) + 8))();
                }
              }
              if (local_88 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_88,local_88);
              }
              iVar2 = BN_nnmod((BIGNUM *)local_48._M_head_impl,(BIGNUM *)local_58._M_head_impl,
                               (BIGNUM *)local_38._M_head_impl,
                               (BN_CTX *)
                               (this->super_BNTest).ctx_._M_t.
                               super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
              local_a8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_90,(internal *)&local_a8,
                           (AssertionResult *)
                           "BN_nnmod(expected.get(), random.get(), power_of_two.get(), ctx())",
                           "false","true",(char *)_Var4._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_98,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x6fb,(char *)CONCAT71(local_90._1_7_,local_90[0]));
                testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
                goto LAB_002c6efa;
              }
              iVar2 = BN_nnmod_pow2(local_50._M_head_impl,local_58._M_head_impl,
                                    (size_t)local_68._M_head_impl);
              local_a8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_90,(internal *)&local_a8,
                           (AssertionResult *)"BN_nnmod_pow2(actual.get(), random.get(), e)","false"
                           ,"true",(char *)_Var4._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_98,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x6fc,(char *)CONCAT71(local_90._1_7_,local_90[0]));
                testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
                goto LAB_002c6efa;
              }
              _Var4._M_head_impl = local_50._M_head_impl;
              AssertBIGNUMSEqual(local_90,"expected.get()","actual.get()",
                                 "random (mod power_of_two), non-negative",local_48._M_head_impl,
                                 local_50._M_head_impl);
              if (local_90[0] == '\0') {
                testing::Message::Message(&local_a8);
                pcVar3 = "";
                if (local_88 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar3 = (local_88->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x6fe,pcVar3);
                testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
                testing::internal::AssertHelper::~AssertHelper(&local_b0);
                if ((long *)CONCAT71(local_a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT71(local_a8.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._1_7_,
                                                 local_a8.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._0_1_) + 8))();
                }
              }
              if (local_88 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_88,local_88);
              }
              BN_set_negative((BIGNUM *)local_58._M_head_impl,1);
              iVar2 = BN_nnmod((BIGNUM *)local_48._M_head_impl,(BIGNUM *)local_58._M_head_impl,
                               (BIGNUM *)local_38._M_head_impl,
                               (BN_CTX *)
                               (this->super_BNTest).ctx_._M_t.
                               super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
              local_a8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_90,(internal *)&local_a8,
                           (AssertionResult *)
                           "BN_nnmod(expected.get(), random.get(), power_of_two.get(), ctx())",
                           "false","true",(char *)_Var4._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_98,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x703,(char *)CONCAT71(local_90._1_7_,local_90[0]));
                testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
                goto LAB_002c6efa;
              }
              iVar2 = BN_nnmod_pow2(local_50._M_head_impl,local_58._M_head_impl,
                                    (size_t)local_68._M_head_impl);
              local_a8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_90,(internal *)&local_a8,
                           (AssertionResult *)"BN_nnmod_pow2(actual.get(), random.get(), e)","false"
                           ,"true",(char *)_Var4._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_98,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x704,(char *)CONCAT71(local_90._1_7_,local_90[0]));
                testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
                goto LAB_002c6efa;
              }
              in_R9._M_head_impl = local_50._M_head_impl;
              AssertBIGNUMSEqual(local_90,"expected.get()","actual.get()",
                                 "-random (mod power_of_two), non-negative",local_48._M_head_impl,
                                 local_50._M_head_impl);
              if (local_90[0] == '\0') {
                testing::Message::Message(&local_a8);
                pcVar3 = "";
                if (local_88 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar3 = (local_88->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x706,pcVar3);
                testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
                testing::internal::AssertHelper::~AssertHelper(&local_b0);
                if ((long *)CONCAT71(local_a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT71(local_a8.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._1_7_,
                                                 local_a8.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._0_1_) + 8))();
                }
              }
              if (local_88 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_88,local_88);
              }
              testing::ScopedTrace::~ScopedTrace(&local_69);
              iVar2 = local_3c + 0x17;
              bVar1 = local_3c < 0x1e9;
              local_3c = iVar2;
            } while (bVar1);
            testing::ScopedTrace::~ScopedTrace(&local_59);
            local_68._M_head_impl = local_68._M_head_impl + 0xb;
          } while (local_68._M_head_impl <
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200)
          ;
          goto LAB_002c6f58;
        }
        testing::Message::Message((Message *)&local_68);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_90,(internal *)&local_a8,(AssertionResult *)"actual","false",
                   "true",(char *)in_R9._M_head_impl);
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x6dd,(char *)CONCAT71(local_90._1_7_,local_90[0]));
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_68);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_90._1_7_,local_90[0]) != &local_80) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_90._1_7_,local_90[0]),local_80._M_allocated_capacity + 1);
  }
  if (local_68._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_68._M_head_impl + 8))();
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
LAB_002c6f58:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_50);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_58);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_38);
  return;
}

Assistant:

TEST_F(BNTest, Pow2) {
  bssl::UniquePtr<BIGNUM> power_of_two(BN_new()), random(BN_new()),
      expected(BN_new()), actual(BN_new());
  ASSERT_TRUE(power_of_two);
  ASSERT_TRUE(random);
  ASSERT_TRUE(expected);
  ASSERT_TRUE(actual);

  // Choose an exponent.
  for (size_t e = 3; e < 512; e += 11) {
    SCOPED_TRACE(e);
    // Choose a bit length for our randoms.
    for (int len = 3; len < 512; len += 23) {
      SCOPED_TRACE(len);
      // Set power_of_two = 2^e.
      ASSERT_TRUE(BN_lshift(power_of_two.get(), BN_value_one(), (int)e));

      // Test BN_is_pow2 on power_of_two.
      EXPECT_TRUE(BN_is_pow2(power_of_two.get()));

      // Pick a large random value, ensuring it isn't a power of two.
      ASSERT_TRUE(
          BN_rand(random.get(), len, BN_RAND_TOP_TWO, BN_RAND_BOTTOM_ANY));

      // Test BN_is_pow2 on |r|.
      EXPECT_FALSE(BN_is_pow2(random.get()));

      // Test BN_mod_pow2 on |r|.
      ASSERT_TRUE(
          BN_mod(expected.get(), random.get(), power_of_two.get(), ctx()));
      ASSERT_TRUE(BN_mod_pow2(actual.get(), random.get(), e));
      EXPECT_BIGNUMS_EQUAL("random (mod power_of_two)", expected.get(),
                           actual.get());

      // Test BN_nnmod_pow2 on |r|.
      ASSERT_TRUE(
          BN_nnmod(expected.get(), random.get(), power_of_two.get(), ctx()));
      ASSERT_TRUE(BN_nnmod_pow2(actual.get(), random.get(), e));
      EXPECT_BIGNUMS_EQUAL("random (mod power_of_two), non-negative",
                           expected.get(), actual.get());

      // Test BN_nnmod_pow2 on -|r|.
      BN_set_negative(random.get(), 1);
      ASSERT_TRUE(
          BN_nnmod(expected.get(), random.get(), power_of_two.get(), ctx()));
      ASSERT_TRUE(BN_nnmod_pow2(actual.get(), random.get(), e));
      EXPECT_BIGNUMS_EQUAL("-random (mod power_of_two), non-negative",
                           expected.get(), actual.get());
    }
  }
}